

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

xmlSchemaTypePtr
xmlSchemaParseComplexType
          (xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr node,int topLevel)

{
  byte *pbVar1;
  xmlSchemaTypePtr pxVar2;
  _xmlAttr *p_Var3;
  bool bVar4;
  int iVar5;
  int iVar6;
  xmlAttrPtr pxVar7;
  xmlSchemaTypePtr pxVar8;
  xmlAttrPtr attr;
  xmlSchemaAnnotPtr pxVar9;
  xmlSchemaTypePtr pxVar10;
  xmlSchemaWildcardPtr pxVar11;
  xmlSchemaTypeType xVar12;
  undefined4 in_register_0000000c;
  xmlNodePtr pxVar13;
  xmlNodePtr extraout_RDX;
  xmlNodePtr ownerComp;
  xmlNodePtr node_00;
  xmlNodePtr node_01;
  xmlNodePtr extraout_RDX_00;
  xmlSchemaBasicItemPtr extraout_RDX_01;
  xmlSchemaBasicItemPtr extraout_RDX_02;
  xmlSchemaBasicItemPtr extraout_RDX_03;
  xmlSchemaBasicItemPtr pxVar14;
  xmlSchemaBasicItemPtr extraout_RDX_04;
  _xmlNode *node_02;
  xmlChar **in_R8;
  char *type;
  char *in_R9;
  xmlNodePtr child;
  xmlChar *name;
  undefined8 in_stack_ffffffffffffff78;
  char *content;
  uint uVar15;
  undefined8 in_stack_ffffffffffffff80;
  xmlNodePtr str1;
  _xmlNode *p_Var16;
  xmlChar *local_50;
  xmlAttrPtr local_48;
  _xmlSchemaType *local_40;
  xmlChar *local_38;
  
  uVar15 = (uint)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  pxVar13 = (xmlNodePtr)CONCAT44(in_register_0000000c,topLevel);
  str1 = (xmlNodePtr)0x0;
  local_48 = (xmlAttrPtr)0x0;
  pxVar2 = ctxt->ctxtType;
  if (topLevel == 0) {
LAB_00197fbd:
    content = (char *)((ulong)uVar15 << 0x20);
    pxVar7 = (xmlAttrPtr)0x0;
    pxVar8 = xmlSchemaAddType(ctxt,schema,XML_SCHEMA_TYPE_COMPLEX,(xmlChar *)0x0,
                              ctxt->targetNamespace,node,0);
    if (pxVar8 == (xmlSchemaTypePtr)0x0) {
      return (xmlSchemaTypePtr)0x0;
    }
    local_48 = (xmlAttrPtr)pxVar8->name;
    pxVar8->node = node;
    pxVar8->type = XML_SCHEMA_TYPE_COMPLEX;
  }
  else {
    pxVar7 = xmlSchemaGetPropNode(node,"name");
    if (pxVar7 == (xmlAttrPtr)0x0) {
      xmlSchemaPMissingAttrErr
                (ctxt,(xmlParserErrors)node,(xmlSchemaBasicItemPtr)0x1ce024,pxVar13,(char *)in_R8,
                 in_R9);
      return (xmlSchemaTypePtr)0x0;
    }
    pxVar8 = xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
    iVar5 = xmlSchemaPValAttrNode
                      (ctxt,(xmlSchemaBasicItemPtr)pxVar7,(xmlAttrPtr)pxVar8,
                       (xmlSchemaTypePtr)&local_48,in_R8);
    if (iVar5 != 0) {
      return (xmlSchemaTypePtr)0x0;
    }
    if (topLevel == 0) goto LAB_00197fbd;
    content = (char *)CONCAT44(uVar15,1);
    pxVar7 = local_48;
    pxVar8 = xmlSchemaAddType(ctxt,schema,XML_SCHEMA_TYPE_COMPLEX,(xmlChar *)local_48,
                              ctxt->targetNamespace,node,1);
    if (pxVar8 == (xmlSchemaTypePtr)0x0) {
      return (xmlSchemaTypePtr)0x0;
    }
    pxVar8->node = node;
    pxVar8->type = XML_SCHEMA_TYPE_COMPLEX;
    *(byte *)&pxVar8->flags = (byte)pxVar8->flags | 8;
  }
  pxVar8->targetNamespace = ctxt->targetNamespace;
  pxVar13 = (xmlNodePtr)node->properties;
  if (pxVar13 == (xmlNodePtr)0x0) {
    bVar4 = true;
    pxVar7 = (xmlAttrPtr)CONCAT71((int7)((ulong)pxVar7 >> 8),1);
  }
  else {
    local_40 = (_xmlSchemaType *)&pxVar8->flags;
    local_38 = (xmlChar *)0x0;
    bVar4 = false;
    do {
      if (pxVar13->ns == (xmlNs *)0x0) {
        iVar5 = xmlStrEqual(pxVar13->name,"id");
        if (iVar5 == 0) {
          iVar5 = xmlStrEqual(pxVar13->name,(xmlChar *)"mixed");
          if (iVar5 == 0) {
            ownerComp = node_00;
            if (topLevel == 0) goto LAB_00198076;
            iVar5 = xmlStrEqual(pxVar13->name,"name");
            if (iVar5 == 0) {
              iVar5 = xmlStrEqual(pxVar13->name,"abstract");
              if (iVar5 == 0) {
                iVar5 = xmlStrEqual(pxVar13->name,(xmlChar *)"final");
                if (iVar5 == 0) {
                  iVar5 = xmlStrEqual(pxVar13->name,(xmlChar *)"block");
                  ownerComp = extraout_RDX_00;
                  if (iVar5 == 0) goto LAB_00198076;
                  local_50 = xmlSchemaGetNodeContent(ctxt,pxVar13);
                  content = (char *)CONCAT44((int)((ulong)content >> 0x20),0xffffffff);
                  pxVar7 = (xmlAttrPtr)0x80000;
                  iVar5 = xmlSchemaPValAttrBlockFinal
                                    (local_50,(int *)local_40,0x40000,0x80000,-1,-1,-1,
                                     (int)in_stack_ffffffffffffff80);
                  if (iVar5 != 0) {
                    type = "(#all | List of (extension | restriction)) ";
                    goto LAB_00198217;
                  }
                  local_38 = &DAT_00000001;
                }
                else {
                  local_50 = xmlSchemaGetNodeContent(ctxt,pxVar13);
                  content = (char *)CONCAT44((int)((ulong)content >> 0x20),0xffffffff);
                  pxVar7 = (xmlAttrPtr)0x400;
                  iVar5 = xmlSchemaPValAttrBlockFinal
                                    (local_50,(int *)local_40,0x200,0x400,-1,-1,-1,
                                     (int)in_stack_ffffffffffffff80);
                  if (iVar5 == 0) {
                    bVar4 = true;
                  }
                  else {
                    type = "(#all | List of (extension | restriction))";
LAB_00198217:
                    in_stack_ffffffffffffff80 = 0;
                    content = (char *)0x0;
                    pxVar7 = (xmlAttrPtr)0x0;
                    xmlSchemaPSimpleTypeErr
                              (ctxt,XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
                               (xmlSchemaBasicItemPtr)pxVar13,(xmlNodePtr)0x0,(xmlSchemaTypePtr)type
                               ,(char *)local_50,(xmlChar *)0x0,(char *)0x0,(xmlChar *)str1,
                               (xmlChar *)schema);
                  }
                }
              }
              else {
                iVar5 = xmlSchemaPGetBoolNodeValue(ctxt,(xmlSchemaBasicItemPtr)pxVar13,node_01);
                if (iVar5 != 0) {
                  pbVar1 = (byte *)((long)&pxVar8->flags + 2);
                  *pbVar1 = *pbVar1 | 0x10;
                }
              }
            }
          }
          else {
            iVar5 = xmlSchemaPGetBoolNodeValue(ctxt,(xmlSchemaBasicItemPtr)pxVar13,node_00);
            if (iVar5 != 0) {
              *(byte *)&pxVar8->flags = (byte)pxVar8->flags | 1;
            }
          }
        }
        else {
          attr = xmlSchemaGetPropNode(node,"id");
          if (attr != (xmlAttrPtr)0x0) {
            xmlSchemaPValAttrNodeID(ctxt,attr);
          }
        }
      }
      else {
        iVar5 = xmlStrEqual(pxVar13->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
        ownerComp = extraout_RDX;
        if (iVar5 != 0) {
LAB_00198076:
          xmlSchemaPIllegalAttrErr
                    (ctxt,(xmlParserErrors)pxVar13,(xmlSchemaBasicItemPtr)ownerComp,pxVar7);
        }
      }
      pxVar13 = pxVar13->next;
    } while (pxVar13 != (_xmlNode *)0x0);
    pxVar7 = (xmlAttrPtr)CONCAT71((int7)((ulong)pxVar7 >> 8),(int)local_38 == 0);
    bVar4 = !bVar4;
  }
  if ((char)pxVar7 != '\0') {
    uVar15 = schema->flags;
    pxVar7 = (xmlAttrPtr)(ulong)uVar15;
    if ((char)uVar15 < '\0') {
      pbVar1 = (byte *)((long)&pxVar8->flags + 2);
      *pbVar1 = *pbVar1 | 8;
    }
    if ((uVar15 & 0x40) != 0) {
      pbVar1 = (byte *)((long)&pxVar8->flags + 2);
      *pbVar1 = *pbVar1 | 4;
    }
  }
  if (bVar4) {
    uVar15 = schema->flags;
    if ((uVar15 & 8) != 0) {
      pbVar1 = (byte *)((long)&pxVar8->flags + 1);
      *pbVar1 = *pbVar1 | 4;
    }
    if ((uVar15 & 4) != 0) {
      pbVar1 = (byte *)((long)&pxVar8->flags + 1);
      *pbVar1 = *pbVar1 | 2;
    }
  }
  pxVar13 = node->children;
  p_Var16 = pxVar13;
  if ((((pxVar13 != (xmlNodePtr)0x0) && (pxVar13->ns != (xmlNs *)0x0)) &&
      (iVar5 = xmlStrEqual(pxVar13->name,(xmlChar *)"annotation"), iVar5 != 0)) &&
     (iVar5 = xmlStrEqual(pxVar13->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
     iVar5 != 0)) {
    pxVar9 = xmlSchemaParseAnnotation(ctxt,pxVar13,1);
    pxVar8->annot = pxVar9;
    p_Var16 = pxVar13->next;
  }
  ctxt->ctxtType = pxVar8;
  pxVar13 = p_Var16;
  if (p_Var16 == (xmlNodePtr)0x0) {
LAB_0019856f:
    pxVar10 = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYTYPE);
    pxVar8->baseType = pxVar10;
    *(byte *)&pxVar8->flags = (byte)pxVar8->flags | 4;
LAB_00198584:
    if (p_Var16 != (xmlNodePtr)0x0) {
      if (((p_Var16->ns == (xmlNs *)0x0) ||
          (iVar5 = xmlStrEqual(p_Var16->name,(xmlChar *)"choice"), iVar5 == 0)) ||
         (iVar5 = xmlStrEqual(p_Var16->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
         iVar5 == 0)) {
        if (p_Var16 == (xmlNodePtr)0x0) goto LAB_00198798;
        if (((p_Var16->ns != (xmlNs *)0x0) &&
            (iVar5 = xmlStrEqual(p_Var16->name,(xmlChar *)"sequence"), iVar5 != 0)) &&
           (iVar5 = xmlStrEqual(p_Var16->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
           iVar5 != 0)) {
          xVar12 = XML_SCHEMA_TYPE_SEQUENCE;
          goto LAB_0019869c;
        }
        if ((((p_Var16 == (xmlNodePtr)0x0) || (p_Var16->ns == (xmlNs *)0x0)) ||
            (iVar5 = xmlStrEqual(p_Var16->name,"group"), iVar5 == 0)) ||
           (iVar5 = xmlStrEqual(p_Var16->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
           iVar5 == 0)) goto LAB_00198798;
        pxVar10 = (xmlSchemaTypePtr)xmlSchemaParseModelGroupDefRef(ctxt,schema,p_Var16);
      }
      else {
        xVar12 = XML_SCHEMA_TYPE_CHOICE;
LAB_0019869c:
        pxVar10 = (xmlSchemaTypePtr)xmlSchemaParseModelGroup(ctxt,schema,p_Var16,xVar12,1);
      }
      pxVar8->subtypes = pxVar10;
      pxVar13 = p_Var16->next;
    }
  }
  else {
    if (((p_Var16->ns != (xmlNs *)0x0) &&
        (iVar5 = xmlStrEqual(p_Var16->name,(xmlChar *)"simpleContent"), iVar5 != 0)) &&
       (iVar5 = xmlStrEqual(p_Var16->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
       iVar5 != 0)) {
      if ((pxVar8->flags & 1U) != 0) {
        pxVar8->flags = pxVar8->flags & 0xfffffffe;
      }
      pxVar10 = ctxt->ctxtType;
      pxVar10->contentType = XML_SCHEMA_CONTENT_SIMPLE;
      for (p_Var3 = p_Var16->properties; p_Var3 != (_xmlAttr *)0x0; p_Var3 = p_Var3->next) {
        if (p_Var3->ns == (xmlNs *)0x0) {
          iVar5 = xmlStrEqual(p_Var3->name,"id");
          pxVar14 = extraout_RDX_02;
          if (iVar5 == 0) goto LAB_001983be;
        }
        else {
          iVar5 = xmlStrEqual(p_Var3->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
          pxVar14 = extraout_RDX_01;
          if (iVar5 != 0) {
LAB_001983be:
            xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var3,pxVar14,pxVar7);
          }
        }
      }
      pxVar7 = xmlSchemaGetPropNode(p_Var16,"id");
      if (pxVar7 != (xmlAttrPtr)0x0) {
        xmlSchemaPValAttrNodeID(ctxt,pxVar7);
      }
      node_02 = p_Var16->children;
      if (node_02 == (xmlNodePtr)0x0) {
        node_02 = (xmlNodePtr)0x0;
      }
      else if (((node_02->ns != (xmlNs *)0x0) &&
               (iVar5 = xmlStrEqual(node_02->name,(xmlChar *)"annotation"), iVar5 != 0)) &&
              (iVar5 = xmlStrEqual(node_02->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
              iVar5 != 0)) {
        pxVar9 = xmlSchemaParseAnnotation(ctxt,node_02,1);
        xmlSchemaAddAnnotation((xmlSchemaAnnotItemPtr)pxVar10,pxVar9);
        node_02 = node_02->next;
      }
      if (node_02 == (xmlNodePtr)0x0) {
LAB_0019893c:
        iVar5 = 0;
        xmlSchemaPContentErr
                  (ctxt,XML_SCHEMAP_S4S_ELEM_MISSING,(xmlSchemaBasicItemPtr)p_Var16,(xmlNodePtr)0x0,
                   (xmlNodePtr)0x0,"(annotation?, (restriction | extension))",content);
        xmlSchemaPContentErr
                  (ctxt,XML_SCHEMAP_S4S_ELEM_MISSING,(xmlSchemaBasicItemPtr)p_Var16,(xmlNodePtr)0x0,
                   (xmlNodePtr)0x0,"(annotation?, (restriction | extension))",content);
        node_02 = (xmlNodePtr)0x0;
      }
      else {
        if (((node_02->ns == (xmlNs *)0x0) ||
            (iVar5 = xmlStrEqual(node_02->name,(xmlChar *)"restriction"), iVar5 == 0)) ||
           (iVar5 = xmlStrEqual(node_02->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
           iVar5 == 0)) {
          iVar5 = 0;
          if (((node_02->ns == (xmlNs *)0x0) ||
              (iVar6 = xmlStrEqual(node_02->name,(xmlChar *)"extension"), iVar6 == 0)) ||
             (iVar6 = xmlStrEqual(node_02->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
             iVar6 == 0)) goto LAB_001989cf;
          xVar12 = XML_SCHEMA_TYPE_SIMPLE_CONTENT;
LAB_001989c0:
          xmlSchemaParseExtension(ctxt,schema,node_02,xVar12);
        }
        else {
          xVar12 = XML_SCHEMA_TYPE_SIMPLE_CONTENT;
LAB_00198932:
          xmlSchemaParseRestriction(ctxt,schema,node_02,xVar12);
        }
        node_02 = node_02->next;
        iVar5 = (int)&DAT_00000001;
      }
LAB_001989cf:
      if (node_02 != (xmlNodePtr)0x0) {
        xmlSchemaPContentErr
                  (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)p_Var16,node_02,
                   (xmlNodePtr)0x0,"(annotation?, (restriction | extension))",content);
      }
      p_Var16 = pxVar13->next;
      goto LAB_00198a04;
    }
    if (p_Var16 == (xmlNodePtr)0x0) goto LAB_0019856f;
    if (((p_Var16->ns != (xmlNs *)0x0) &&
        (iVar5 = xmlStrEqual(p_Var16->name,(xmlChar *)"complexContent"), iVar5 != 0)) &&
       (iVar5 = xmlStrEqual(p_Var16->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
       iVar5 != 0)) {
      pxVar8->contentType = XML_SCHEMA_CONTENT_EMPTY;
      pxVar10 = ctxt->ctxtType;
      for (p_Var3 = p_Var16->properties; p_Var3 != (_xmlAttr *)0x0; p_Var3 = p_Var3->next) {
        if (p_Var3->ns == (xmlNs *)0x0) {
          iVar5 = xmlStrEqual(p_Var3->name,"id");
          if ((iVar5 == 0) &&
             (iVar5 = xmlStrEqual(p_Var3->name,(xmlChar *)"mixed"), pxVar14 = extraout_RDX_04,
             iVar5 == 0)) goto LAB_00198478;
        }
        else {
          iVar5 = xmlStrEqual(p_Var3->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
          pxVar14 = extraout_RDX_03;
          if (iVar5 != 0) {
LAB_00198478:
            xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var3,pxVar14,pxVar7);
          }
        }
      }
      iVar5 = (int)pxVar7;
      pxVar7 = xmlSchemaGetPropNode(p_Var16,"id");
      if (pxVar7 != (xmlAttrPtr)0x0) {
        xmlSchemaPValAttrNodeID(ctxt,pxVar7);
      }
      iVar5 = xmlGetBooleanProp(ctxt,p_Var16,"mixed",iVar5);
      if ((iVar5 != 0) && ((pxVar10->flags & 1U) == 0)) {
        pxVar10->flags = pxVar10->flags | 1;
      }
      node_02 = p_Var16->children;
      if (node_02 == (xmlNodePtr)0x0) {
        node_02 = (xmlNodePtr)0x0;
      }
      else if (((node_02->ns != (xmlNs *)0x0) &&
               (iVar5 = xmlStrEqual(node_02->name,(xmlChar *)"annotation"), iVar5 != 0)) &&
              (iVar5 = xmlStrEqual(node_02->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
              iVar5 != 0)) {
        pxVar9 = xmlSchemaParseAnnotation(ctxt,node_02,1);
        xmlSchemaAddAnnotation((xmlSchemaAnnotItemPtr)pxVar10,pxVar9);
        node_02 = node_02->next;
      }
      if (node_02 != (xmlNodePtr)0x0) {
        if (((node_02->ns == (xmlNs *)0x0) ||
            (iVar5 = xmlStrEqual(node_02->name,(xmlChar *)"restriction"), iVar5 == 0)) ||
           (iVar5 = xmlStrEqual(node_02->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
           iVar5 == 0)) {
          iVar5 = 0;
          if (((node_02->ns != (xmlNs *)0x0) &&
              (iVar6 = xmlStrEqual(node_02->name,(xmlChar *)"extension"), iVar6 != 0)) &&
             (iVar6 = xmlStrEqual(node_02->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
             iVar6 != 0)) {
            xVar12 = XML_SCHEMA_TYPE_COMPLEX_CONTENT;
            goto LAB_001989c0;
          }
          goto LAB_001989cf;
        }
        xVar12 = XML_SCHEMA_TYPE_COMPLEX_CONTENT;
        goto LAB_00198932;
      }
      goto LAB_0019893c;
    }
    pxVar10 = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYTYPE);
    *(byte *)&pxVar8->flags = (byte)pxVar8->flags | 4;
    pxVar8->baseType = pxVar10;
    if (p_Var16 != (xmlNodePtr)0x0) {
      if (((p_Var16->ns == (xmlNs *)0x0) || (iVar5 = xmlStrEqual(p_Var16->name,"all"), iVar5 == 0))
         || (iVar5 = xmlStrEqual(p_Var16->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
            iVar5 == 0)) goto LAB_00198584;
      xVar12 = XML_SCHEMA_TYPE_ALL;
      goto LAB_0019869c;
    }
  }
LAB_00198798:
  iVar5 = 0;
  iVar6 = xmlSchemaParseLocalAttributes
                    (ctxt,schema,(xmlNodePtr *)&stack0xffffffffffffff88,
                     (xmlSchemaItemListPtr *)&pxVar8->attrUses,0xc,(int *)0x0);
  if (iVar6 == -1) {
    return (xmlSchemaTypePtr)0x0;
  }
  p_Var16 = pxVar13;
  if (((pxVar13 != (xmlNodePtr)0x0) && (pxVar13->ns != (xmlNs *)0x0)) &&
     ((iVar6 = xmlStrEqual(pxVar13->name,(xmlChar *)"anyAttribute"), iVar6 != 0 &&
      (iVar6 = xmlStrEqual(pxVar13->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
      iVar5 = 0, iVar6 != 0)))) {
    pxVar11 = xmlSchemaParseAnyAttribute(ctxt,schema,pxVar13);
    pxVar8->attributeWildcard = pxVar11;
    p_Var16 = pxVar13->next;
  }
LAB_00198a04:
  if (p_Var16 != (xmlNodePtr)0x0) {
    xmlSchemaPContentErr
              (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node,p_Var16,
               (xmlNodePtr)0x0,
               "(annotation?, (simpleContent | complexContent | ((group | all | choice | sequence)?, ((attribute | attributeGroup)*, anyAttribute?))))"
               ,content);
  }
  if (((topLevel != 0) && (iVar5 == 0)) && (ctxt->isRedefine != 0)) {
    xmlSchemaPCustomErrExt
              (ctxt,XML_SCHEMAP_SRC_REDEFINE,(xmlSchemaBasicItemPtr)0x0,node,
               "This is a redefinition, thus the <complexType> must have a <restriction> or <extension> grand-child"
               ,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0);
  }
  ctxt->ctxtType = pxVar2;
  return pxVar8;
}

Assistant:

static xmlSchemaTypePtr
xmlSchemaParseComplexType(xmlSchemaParserCtxtPtr ctxt, xmlSchemaPtr schema,
                          xmlNodePtr node, int topLevel)
{
    xmlSchemaTypePtr type, ctxtType;
    xmlNodePtr child = NULL;
    const xmlChar *name = NULL;
    xmlAttrPtr attr;
    const xmlChar *attrValue;
#ifdef ENABLE_NAMED_LOCALS
    char buf[40];
#endif
    int final = 0, block = 0, hasRestrictionOrExtension = 0;


    if ((ctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);

    ctxtType = ctxt->ctxtType;

    if (topLevel) {
	attr = xmlSchemaGetPropNode(node, "name");
	if (attr == NULL) {
	    xmlSchemaPMissingAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_MISSING, NULL, node, "name", NULL);
	    return (NULL);
	} else if (xmlSchemaPValAttrNode(ctxt, NULL, attr,
	    xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME), &name) != 0) {
	    return (NULL);
	}
    }

    if (topLevel == 0) {
	/*
	* Parse as local complex type definition.
	*/
#ifdef ENABLE_NAMED_LOCALS
        snprintf(buf, 39, "#CT%d", ctxt->counter++ + 1);
	type = xmlSchemaAddType(ctxt, schema,
	    XML_SCHEMA_TYPE_COMPLEX,
	    xmlDictLookup(ctxt->dict, (const xmlChar *)buf, -1),
	    ctxt->targetNamespace, node, 0);
#else
	type = xmlSchemaAddType(ctxt, schema,
	    XML_SCHEMA_TYPE_COMPLEX,
	    NULL, ctxt->targetNamespace, node, 0);
#endif
	if (type == NULL)
	    return (NULL);
	name = type->name;
	type->node = node;
	type->type = XML_SCHEMA_TYPE_COMPLEX;
	/*
	* TODO: We need the target namespace.
	*/
    } else {
	/*
	* Parse as global complex type definition.
	*/
	type = xmlSchemaAddType(ctxt, schema,
	    XML_SCHEMA_TYPE_COMPLEX,
	    name, ctxt->targetNamespace, node, 1);
	if (type == NULL)
	    return (NULL);
	type->node = node;
	type->type = XML_SCHEMA_TYPE_COMPLEX;
	type->flags |= XML_SCHEMAS_TYPE_GLOBAL;
    }
    type->targetNamespace = ctxt->targetNamespace;
    /*
    * Handle attributes.
    */
    attr = node->properties;
    while (attr != NULL) {
	if (attr->ns == NULL) {
	    if (xmlStrEqual(attr->name, BAD_CAST "id")) {
		/*
		* Attribute "id".
		*/
		xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");
	    } else if (xmlStrEqual(attr->name, BAD_CAST "mixed")) {
		/*
		* Attribute "mixed".
		*/
		if (xmlSchemaPGetBoolNodeValue(ctxt,
			NULL, (xmlNodePtr) attr))
		    type->flags |= XML_SCHEMAS_TYPE_MIXED;
	    } else if (topLevel) {
		/*
		* Attributes of global complex type definitions.
		*/
		if (xmlStrEqual(attr->name, BAD_CAST "name")) {
		    /* Pass. */
		} else if (xmlStrEqual(attr->name, BAD_CAST "abstract")) {
		    /*
		    * Attribute "abstract".
		    */
		    if (xmlSchemaPGetBoolNodeValue(ctxt,
			    NULL, (xmlNodePtr) attr))
			type->flags |= XML_SCHEMAS_TYPE_ABSTRACT;
		} else if (xmlStrEqual(attr->name, BAD_CAST "final")) {
		    /*
		    * Attribute "final".
		    */
		    attrValue = xmlSchemaGetNodeContent(ctxt,
			(xmlNodePtr) attr);
		    if (xmlSchemaPValAttrBlockFinal(attrValue,
			&(type->flags),
			-1,
			XML_SCHEMAS_TYPE_FINAL_EXTENSION,
			XML_SCHEMAS_TYPE_FINAL_RESTRICTION,
			-1, -1, -1) != 0)
		    {
			xmlSchemaPSimpleTypeErr(ctxt,
			    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
			    NULL, (xmlNodePtr) attr, NULL,
			    "(#all | List of (extension | restriction))",
			    attrValue, NULL, NULL, NULL);
		    } else
			final = 1;
		} else if (xmlStrEqual(attr->name, BAD_CAST "block")) {
		    /*
		    * Attribute "block".
		    */
		    attrValue = xmlSchemaGetNodeContent(ctxt,
			(xmlNodePtr) attr);
		    if (xmlSchemaPValAttrBlockFinal(attrValue, &(type->flags),
			-1,
			XML_SCHEMAS_TYPE_BLOCK_EXTENSION,
			XML_SCHEMAS_TYPE_BLOCK_RESTRICTION,
			-1, -1, -1) != 0) {
			xmlSchemaPSimpleTypeErr(ctxt,
			    XML_SCHEMAP_S4S_ATTR_INVALID_VALUE,
			    NULL, (xmlNodePtr) attr, NULL,
			    "(#all | List of (extension | restriction)) ",
			    attrValue, NULL, NULL, NULL);
		    } else
			block = 1;
		} else {
			xmlSchemaPIllegalAttrErr(ctxt,
			    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
		}
	    } else {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	} else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
	    xmlSchemaPIllegalAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	}
	attr = attr->next;
    }
    if (! block) {
	/*
	* Apply default "block" values.
	*/
	if (schema->flags & XML_SCHEMAS_BLOCK_DEFAULT_RESTRICTION)
	    type->flags |= XML_SCHEMAS_TYPE_BLOCK_RESTRICTION;
	if (schema->flags & XML_SCHEMAS_BLOCK_DEFAULT_EXTENSION)
	    type->flags |= XML_SCHEMAS_TYPE_BLOCK_EXTENSION;
    }
    if (! final) {
	/*
	* Apply default "block" values.
	*/
	if (schema->flags & XML_SCHEMAS_FINAL_DEFAULT_RESTRICTION)
	    type->flags |= XML_SCHEMAS_TYPE_FINAL_RESTRICTION;
	if (schema->flags & XML_SCHEMAS_FINAL_DEFAULT_EXTENSION)
	    type->flags |= XML_SCHEMAS_TYPE_FINAL_EXTENSION;
    }
    /*
    * And now for the children...
    */
    child = node->children;
    if (IS_SCHEMA(child, "annotation")) {
        type->annot = xmlSchemaParseAnnotation(ctxt, child, 1);
        child = child->next;
    }
    ctxt->ctxtType = type;
    if (IS_SCHEMA(child, "simpleContent")) {
	/*
	* <complexType><simpleContent>...
	* 3.4.3 : 2.2
	* Specifying mixed='true' when the <simpleContent>
	* alternative is chosen has no effect
	*/
	if (type->flags & XML_SCHEMAS_TYPE_MIXED)
	    type->flags ^= XML_SCHEMAS_TYPE_MIXED;
        xmlSchemaParseSimpleContent(ctxt, schema, child,
	    &hasRestrictionOrExtension);
        child = child->next;
    } else if (IS_SCHEMA(child, "complexContent")) {
	/*
	* <complexType><complexContent>...
	*/
	type->contentType = XML_SCHEMA_CONTENT_EMPTY;
        xmlSchemaParseComplexContent(ctxt, schema, child,
	    &hasRestrictionOrExtension);
        child = child->next;
    } else {
	/*
	* E.g <complexType><sequence>... or <complexType><attribute>... etc.
	*
	* SPEC
	* "...the third alternative (neither <simpleContent> nor
	* <complexContent>) is chosen. This case is understood as shorthand
	* for complex content restricting the `ur-type definition`, and the
	* details of the mappings should be modified as necessary.
	*/
	type->baseType = xmlSchemaGetBuiltInType(XML_SCHEMAS_ANYTYPE);
	type->flags |= XML_SCHEMAS_TYPE_DERIVATION_METHOD_RESTRICTION;
	/*
	* Parse model groups.
	*/
        if (IS_SCHEMA(child, "all")) {
            type->subtypes = (xmlSchemaTypePtr)
		xmlSchemaParseModelGroup(ctxt, schema, child,
		    XML_SCHEMA_TYPE_ALL, 1);
            child = child->next;
        } else if (IS_SCHEMA(child, "choice")) {
            type->subtypes = (xmlSchemaTypePtr)
		xmlSchemaParseModelGroup(ctxt, schema, child,
		    XML_SCHEMA_TYPE_CHOICE, 1);
            child = child->next;
        } else if (IS_SCHEMA(child, "sequence")) {
            type->subtypes = (xmlSchemaTypePtr)
		xmlSchemaParseModelGroup(ctxt, schema, child,
		    XML_SCHEMA_TYPE_SEQUENCE, 1);
            child = child->next;
        } else if (IS_SCHEMA(child, "group")) {
            type->subtypes = (xmlSchemaTypePtr)
		xmlSchemaParseModelGroupDefRef(ctxt, schema, child);
	    /*
	    * Note that the reference will be resolved in
	    * xmlSchemaResolveTypeReferences();
	    */
            child = child->next;
        }
	/*
	* Parse attribute decls/refs.
	*/
        if (xmlSchemaParseLocalAttributes(ctxt, schema, &child,
	    (xmlSchemaItemListPtr *) &(type->attrUses),
	    XML_SCHEMA_TYPE_RESTRICTION, NULL) == -1)
	    return(NULL);
	/*
	* Parse attribute wildcard.
	*/
	if (IS_SCHEMA(child, "anyAttribute")) {
	    type->attributeWildcard = xmlSchemaParseAnyAttribute(ctxt, schema, child);
	    child = child->next;
	}
    }
    if (child != NULL) {
	xmlSchemaPContentErr(ctxt,
	    XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
	    NULL, node, child,
	    NULL, "(annotation?, (simpleContent | complexContent | "
	    "((group | all | choice | sequence)?, ((attribute | "
	    "attributeGroup)*, anyAttribute?))))");
    }
    /*
    * REDEFINE: SPEC src-redefine (5)
    */
    if (topLevel && ctxt->isRedefine && (! hasRestrictionOrExtension)) {
	xmlSchemaPCustomErr(ctxt, XML_SCHEMAP_SRC_REDEFINE,
	    NULL, node, "This is a redefinition, thus the "
	    "<complexType> must have a <restriction> or <extension> "
	    "grand-child", NULL);
    }
    ctxt->ctxtType = ctxtType;
    return (type);
}